

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Taproot_bip86_Test::TestBody(Descriptor_Parse_Taproot_bip86_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference this_00;
  char *in_R9;
  AssertHelper local_1160;
  Message local_1158;
  string local_1150;
  undefined1 local_1130 [8];
  AssertionResult gtest_ar_8;
  Message local_1118;
  string local_1110;
  undefined1 local_10f0 [8];
  AssertionResult gtest_ar_7;
  Message local_10d8;
  string local_10d0;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_6;
  Message local_1098;
  undefined1 local_1090 [8];
  AssertionResult gtest_ar_5;
  Message local_1078;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1070;
  SchnorrPubkey local_1058;
  AssertHelper local_1040;
  Message local_1038;
  Address local_1030;
  string local_eb8;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_4;
  Message local_e80;
  HashType local_e78 [2];
  undefined1 local_e70 [8];
  AssertionResult gtest_ar_3;
  Message local_e58;
  AddressType local_e50 [2];
  undefined1 local_e48 [8];
  AssertionResult gtest_ar_2;
  Message local_e30;
  TapBranch local_e28;
  AssertHelper local_db0;
  Message local_da8;
  string local_da0;
  AssertHelper local_d80;
  Message local_d78;
  Script local_d70;
  string local_d38;
  AssertHelper local_d18;
  Message local_d10;
  bool local_d01;
  undefined1 local_d00 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_cd0;
  Message local_cc8;
  bool local_cb9;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_c88;
  Message local_c80;
  bool local_c71;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_c40;
  Message local_c38;
  bool local_c29;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_bf8;
  Message local_bf0;
  bool local_be1;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar__2;
  Message local_bc8;
  uint32_t local_bc0 [2];
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b88;
  Message local_b80;
  bool local_b71;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b40;
  Message local_b38;
  bool local_b29;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_;
  Message local_b10;
  DescriptorScriptReference local_b08;
  undefined4 local_7b4;
  AssertionResult gtest_ar;
  CfdException *except;
  NetType local_61c;
  undefined1 local_618 [4];
  NetType nettype;
  SchnorrPubkey pubkey;
  TapBranch tree;
  DescriptorScriptReference script_ref;
  undefined1 local_230 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  undefined1 local_68 [8];
  string descriptor1;
  allocator local_31;
  undefined1 local_30 [8];
  string pubkey_hex;
  Descriptor_Parse_Taproot_bip86_Test *this_local;
  
  pubkey_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,"83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,
             "tr(83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145)",
             (allocator *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_230,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &tree.branch_list_.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TapBranch::TapBranch
            ((TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_618);
  local_61c = kMainnet;
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_68,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_b08,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &tree.branch_list_.
                  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_b08);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_b08);
    }
  }
  else {
    testing::Message::Message(&local_b10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x565,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_b10);
  }
  local_b29 = cfd::core::DescriptorScriptReference::HasKey
                        ((DescriptorScriptReference *)
                         &tree.branch_list_.
                          super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b28,&local_b29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b28,
               (AssertionResult *)"script_ref.HasKey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x566,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b40,&local_b38);
    testing::internal::AssertHelper::~AssertHelper(&local_b40);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  local_b71 = cfd::core::DescriptorScriptReference::HasAddress
                        ((DescriptorScriptReference *)
                         &tree.branch_list_.
                          super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b70,&local_b71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
  if (!bVar1) {
    testing::Message::Message(&local_b80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_b70,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x567,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b88,&local_b80);
    testing::internal::AssertHelper::~AssertHelper(&local_b88);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
  local_bc0[1] = 1;
  local_bc0[0] = cfd::core::DescriptorScriptReference::GetKeyNum
                           ((DescriptorScriptReference *)
                            &tree.branch_list_.
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_bb8,"1","script_ref.GetKeyNum()",(int *)(local_bc0 + 1),
             local_bc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x568,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_be1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_be0,&local_be1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar1) {
    testing::Message::Message(&local_bf0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_be0,
               (AssertionResult *)"script_ref.HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x569,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bf8,&local_bf0);
    testing::internal::AssertHelper::~AssertHelper(&local_bf8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c29 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c28,&local_c29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
  if (!bVar1) {
    testing::Message::Message(&local_c38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_c28,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x56a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c40,&local_c38);
    testing::internal::AssertHelper::~AssertHelper(&local_c40);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c71 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c70,&local_c71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar1) {
    testing::Message::Message(&local_c80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_c70,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x56b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c88,&local_c80);
    testing::internal::AssertHelper::~AssertHelper(&local_c88);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  bVar1 = cfd::core::DescriptorScriptReference::HasScriptTree
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_cb9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cb8,&local_cb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar1) {
    testing::Message::Message(&local_cc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_cb8,
               (AssertionResult *)"script_ref.HasScriptTree()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x56c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cd0,&local_cc8);
    testing::internal::AssertHelper::~AssertHelper(&local_cd0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  local_d01 = cfd::core::DescriptorScriptReference::HasTapBranch
                        ((DescriptorScriptReference *)
                         &tree.branch_list_.
                          super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d00,&local_d01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d00);
  if (!bVar1) {
    testing::Message::Message(&local_d10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d38,(internal *)local_d00,(AssertionResult *)"script_ref.HasTapBranch()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x56d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d18,&local_d10);
    testing::internal::AssertHelper::~AssertHelper(&local_d18);
    std::__cxx11::string::~string((string *)&local_d38);
    testing::Message::~Message(&local_d10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d00);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_d70,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_d70);
      cfd::core::Script::~Script(&local_d70);
    }
  }
  else {
    testing::Message::Message(&local_d78);
    testing::internal::AssertHelper::AssertHelper
              (&local_d80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x56e,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d80,&local_d78);
    testing::internal::AssertHelper::~AssertHelper(&local_d80);
    testing::Message::~Message(&local_d78);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_da0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=((string *)local_230,(string *)&local_da0);
      std::__cxx11::string::~string((string *)&local_da0);
    }
  }
  else {
    testing::Message::Message(&local_da8);
    testing::internal::AssertHelper::AssertHelper
              (&local_db0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x56f,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_db0,&local_da8);
    testing::internal::AssertHelper::~AssertHelper(&local_db0);
    testing::Message::~Message(&local_da8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetTapBranch
                (&local_e28,
                 (DescriptorScriptReference *)
                 &tree.branch_list_.
                  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::TapBranch::operator=
                ((TapBranch *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_e28);
      cfd::core::TapBranch::~TapBranch(&local_e28);
    }
  }
  else {
    testing::Message::Message(&local_e30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x570,
               "Expected: tree = script_ref.GetTapBranch() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e30);
  }
  local_e50[1] = 7;
  local_e50[0] = cfd::core::DescriptorScriptReference::GetAddressType
                           ((DescriptorScriptReference *)
                            &tree.branch_list_.
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_e48,"AddressType::kTaprootAddress",
             "script_ref.GetAddressType()",local_e50 + 1,local_e50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar1) {
    testing::Message::Message(&local_e58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x571,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  local_e78[1] = 6;
  local_e78[0] = cfd::core::DescriptorScriptReference::GetHashType
                           ((DescriptorScriptReference *)
                            &tree.branch_list_.
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_e70,"HashType::kTaproot","script_ref.GetHashType()",
             local_e78 + 1,local_e78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e70);
  if (!bVar1) {
    testing::Message::Message(&local_e80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x572,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e70);
  cfd::core::DescriptorScriptReference::GenerateAddress
            (&local_1030,
             (DescriptorScriptReference *)
             &tree.branch_list_.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_61c);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_eb8,&local_1030);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[63]>
            ((EqHelper<false> *)local_e98,"script_ref.GenerateAddress(nettype).GetAddress()",
             "\"bc1p4qhjn9zdvkux4e44uhx8tc55attvtyu358kutcqkudyccelu0was9fqzwh\"",&local_eb8,
             (char (*) [63])"bc1p4qhjn9zdvkux4e44uhx8tc55attvtyu358kutcqkudyccelu0was9fqzwh");
  std::__cxx11::string::~string((string *)&local_eb8);
  cfd::core::Address::~Address(&local_1030);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e98);
  if (!bVar1) {
    testing::Message::Message(&local_1038);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e98);
    testing::internal::AssertHelper::AssertHelper
              (&local_1040,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x574,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1040,&local_1038);
    testing::internal::AssertHelper::~AssertHelper(&local_1040);
    testing::Message::~Message(&local_1038);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e98);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_1070,
                 (DescriptorScriptReference *)
                 &tree.branch_list_.
                  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_1070,0);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_1058,this_00);
      cfd::core::SchnorrPubkey::operator=((SchnorrPubkey *)local_618,&local_1058);
      cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_1058);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_1070);
    }
  }
  else {
    testing::Message::Message(&local_1078);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x575,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1078);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1078);
  }
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1090,"desc_str","descriptor1",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1090);
  if (!bVar1) {
    testing::Message::Message(&local_1098);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1090);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x576,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1090);
  cfd::core::Script::ToString_abi_cxx11_(&local_10d0,(Script *)((long)&desc_str.field_2 + 8));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[67]>
            ((EqHelper<false> *)local_10b0,"locking_script.ToString()",
             "\"1 a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb\"",&local_10d0,
             (char (*) [67])"1 a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb");
  std::__cxx11::string::~string((string *)&local_10d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar1) {
    testing::Message::Message(&local_10d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x578,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_10d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_10d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1110,(SchnorrPubkey *)local_618);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_10f0,"pubkey.GetHex()","pubkey_hex",&local_1110,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::__cxx11::string::~string((string *)&local_1110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f0);
  if (!bVar1) {
    testing::Message::Message(&local_1118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x579,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f0);
  cfd::core::TapBranch::ToString_abi_cxx11_
            (&local_1150,
             (TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[1]>
            ((EqHelper<false> *)local_1130,"tree.ToString()","\"\"",&local_1150,
             (char (*) [1])0x761039);
  std::__cxx11::string::~string((string *)&local_1150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1130);
  if (!bVar1) {
    testing::Message::Message(&local_1158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1130);
    testing::internal::AssertHelper::AssertHelper
              (&local_1160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x57a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1160,&local_1158);
    testing::internal::AssertHelper::~AssertHelper(&local_1160);
    testing::Message::~Message(&local_1158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1130);
  local_7b4 = 0;
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_618);
  cfd::core::TapBranch::~TapBranch
            ((TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &tree.branch_list_.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_230);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_bip86) {
  // https://github.com/bitcoin/bips/blob/master/bip-0086.mediawiki
  // Account 0, second receiving address = m/86'/0'/0'/0/1
  // xprv         = xprvA449goEeU9okyiF1LmKiDaTgeXvmh87DVyRd35VPbsSop8n8uALpbtrUhUXByPFKK7C2yuqrB1FrhiDkEMC4RGmA5KTwsE1aB5jRu9zHsuQ
  // xpub         = xpub6H3W6JmYJXN4CCKUSnriaiQRCZmG6aq4sCMDqTu1ACyngw7HShf59hAxYjXgKDuuHThVEUzdHrc3aXCr9kfvQvZPit5dnD3K9xVRBzjK3rX
  // internal_key = 83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145
  // output_key   = a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // scriptPubKey = 5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // address      = bc1p4qhjn9zdvkux4e44uhx8tc55attvtyu358kutcqkudyccelu0was9fqzwh
  std::string pubkey_hex = "83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145";
  std::string descriptor1 = "tr(83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  TapBranch tree;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kMainnet;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
    return;
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_TRUE(script_ref.HasTapBranch());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(tree = script_ref.GetTapBranch());
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_EQ(script_ref.GenerateAddress(nettype).GetAddress(),
      "bc1p4qhjn9zdvkux4e44uhx8tc55attvtyu358kutcqkudyccelu0was9fqzwh");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_EQ(desc_str, descriptor1);
  EXPECT_EQ(locking_script.ToString(),
      "1 a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb");
  EXPECT_EQ(pubkey.GetHex(), pubkey_hex);
  EXPECT_EQ(tree.ToString(), "");
}